

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O1

void Assimp::FBX::ParseVectorDataArray
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *out,Element *el)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Token *t;
  pointer ppTVar2;
  char *end;
  pointer pcVar3;
  int iVar4;
  size_t __n;
  Scope *sc;
  Element *pEVar5;
  Element *in_R9;
  long lVar6;
  pointer ppTVar7;
  char type;
  vector<char,_std::allocator<char>_> buff;
  char *data;
  uint32_t count;
  char local_79;
  string local_78;
  vector<char,_std::allocator<char>_> local_58;
  char *local_38;
  uint local_2c;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(out,0);
  ppTVar7 = (el->tokens).
            super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar7 ==
      (el->tokens).
      super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"unexpected empty element","");
    anon_unknown.dwarf_1084233::ParseError(&local_78,el);
  }
  t = *ppTVar7;
  if (t->column == 0xffffffff) {
    local_38 = t->sbegin;
    end = t->send;
    anon_unknown_20::ReadBinaryDataArrayHead(&local_38,end,&local_79,&local_2c,el);
    if ((ulong)local_2c != 0) {
      if (local_79 != 'i') {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"expected (u)int array (binary)","");
        anon_unknown.dwarf_1084233::ParseError(&local_78,el);
      }
      local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      anon_unknown_20::ReadBinaryDataArray('i',local_2c,&local_38,end,&local_58,in_R9);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(out,(ulong)local_2c);
      pcVar3 = local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = 0;
      do {
        if (*(int *)(pcVar3 + lVar6 * 4) < 0) {
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,"encountered negative integer index (binary)","");
          anon_unknown.dwarf_1084233::ParseError(&local_78,(Element *)0x0);
        }
        local_78._M_dataplus._M_p._0_4_ = *(int *)(pcVar3 + lVar6 * 4);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (out,(uint *)&local_78);
        lVar6 = lVar6 + 1;
      } while (local_2c != (uint)lVar6);
      if (local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  else {
    __n = ParseTokenAsDim(t);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(out,__n);
    sc = GetRequiredScope(el);
    paVar1 = &local_78.field_2;
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"a","");
    pEVar5 = GetRequiredElement(sc,&local_78,el);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    ppTVar7 = (pEVar5->tokens).
              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppTVar2 = (pEVar5->tokens).
              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppTVar7 != ppTVar2) {
      do {
        iVar4 = ParseTokenAsInt(*ppTVar7);
        if (iVar4 < 0) {
          local_78._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,"encountered negative integer index","");
          anon_unknown.dwarf_1084233::ParseError(&local_78,(Element *)0x0);
        }
        ppTVar7 = ppTVar7 + 1;
        local_78._M_dataplus._M_p._0_4_ = iVar4;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (out,(uint *)&local_78);
      } while (ppTVar7 != ppTVar2);
    }
  }
  return;
}

Assistant:

void ParseVectorDataArray(std::vector<unsigned int>& out, const Element& el)
{
    out.resize( 0 );
    const TokenList& tok = el.Tokens();
    if(tok.empty()) {
        ParseError("unexpected empty element",&el);
    }

    if(tok[0]->IsBinary()) {
        const char* data = tok[0]->begin(), *end = tok[0]->end();

        char type;
        uint32_t count;
        ReadBinaryDataArrayHead(data, end, type, count, el);

        if(!count) {
            return;
        }

        if (type != 'i') {
            ParseError("expected (u)int array (binary)",&el);
        }

        std::vector<char> buff;
        ReadBinaryDataArray(type, count, data, end, buff, el);

        ai_assert(data == end);
        ai_assert(buff.size() == count * 4);

        out.reserve(count);

        const int32_t* ip = reinterpret_cast<const int32_t*>(&buff[0]);
        for (unsigned int i = 0; i < count; ++i, ++ip) {
            BE_NCONST int32_t val = *ip;
            if(val < 0) {
                ParseError("encountered negative integer index (binary)");
            }

            AI_SWAP4(val);
            out.push_back(val);
        }

        return;
    }

    const size_t dim = ParseTokenAsDim(*tok[0]);

    // see notes in ParseVectorDataArray()
    out.reserve(dim);

    const Scope& scope = GetRequiredScope(el);
    const Element& a = GetRequiredElement(scope,"a",&el);

    for (TokenList::const_iterator it = a.Tokens().begin(), end = a.Tokens().end(); it != end; ) {
        const int ival = ParseTokenAsInt(**it++);
        if(ival < 0) {
            ParseError("encountered negative integer index");
        }
        out.push_back(static_cast<unsigned int>(ival));
    }
}